

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::WriteIndent(TextGenerator *this)

{
  int iVar1;
  LogMessage *pLVar2;
  char *local_48;
  void *void_buffer;
  int size;
  byte local_29;
  LogMessage local_28;
  Voidify local_11;
  TextGenerator *local_10;
  TextGenerator *this_local;
  
  if (this->indent_level_ != 0) {
    local_29 = 0;
    local_10 = this;
    if ((this->failed_ & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x609,"!failed_");
      local_29 = 1;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    }
    if ((local_29 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_28);
    }
    void_buffer._0_4_ = (*(this->super_BaseTextGenerator)._vptr_BaseTextGenerator[4])();
    while (this->buffer_size_ < (int)void_buffer) {
      if (0 < this->buffer_size_) {
        memset(this->buffer_,0x20,(long)this->buffer_size_);
      }
      void_buffer._0_4_ = (int)void_buffer - this->buffer_size_;
      iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_48,&this->buffer_size_);
      this->failed_ = (bool)(((byte)iVar1 ^ 0xff) & 1);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
      this->buffer_ = local_48;
    }
    memset(this->buffer_,0x20,(long)(int)void_buffer);
    this->buffer_ = this->buffer_ + (int)void_buffer;
    this->buffer_size_ = this->buffer_size_ - (int)void_buffer;
  }
  return;
}

Assistant:

void WriteIndent() {
    if (indent_level_ == 0) {
      return;
    }
    ABSL_DCHECK(!failed_);
    int size = GetCurrentIndentationSize();

    while (size > buffer_size_) {
      // Data exceeds space in the buffer. Write what we can and request a new
      // buffer.
      if (buffer_size_ > 0) {
        memset(buffer_, ' ', buffer_size_);
      }
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memset(buffer_, ' ', size);
    buffer_ += size;
    buffer_size_ -= size;
  }